

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::SharedLibraryShellCommand::configureOutputs
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  pointer ppBVar1;
  BuildNode *pBVar2;
  pointer pcVar3;
  BuildNode **output;
  pointer ppBVar4;
  Child local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string *local_48;
  StringRef local_40;
  
  llbuild::buildsystem::ExternalCommand::configureOutputs(&this->super_ExternalCommand,ctx,value);
  ppBVar4 = (this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar4 != ppBVar1) {
    local_48 = (string *)&this->sharedLibName;
    do {
      pBVar2 = *ppBVar4;
      if (pBVar2->type != Virtual) {
        if ((this->sharedLibName)._M_string_length == 0) {
          pcVar3 = (pBVar2->super_Node).name._M_dataplus._M_p;
          local_68.twine = (Twine *)&local_58;
          if (pcVar3 == (pointer)0x0) {
            local_60 = 0;
            local_58 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,pcVar3,
                       pcVar3 + (pBVar2->super_Node).name._M_string_length);
          }
          std::__cxx11::string::operator=(local_48,(string *)&local_68.character);
          if (local_68.twine != (Twine *)&local_58) {
            operator_delete(local_68.twine,CONCAT71(uStack_57,local_58) + 1);
          }
        }
        else {
          local_40.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
          local_40.Length = (pBVar2->super_Node).name._M_string_length;
          llvm::Twine::Twine((Twine *)&local_68,"unexpected explicit output: ",&local_40);
          llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_68);
        }
      }
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 != ppBVar1);
  }
  if ((this->sharedLibName)._M_string_length == 0) {
    llvm::Twine::Twine((Twine *)&local_68,
                       "SharedLibraryTool requires the resulting shared library name to be specified"
                      );
    llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_68);
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    ExternalCommand::configureOutputs(ctx, value);

    for (const auto& output : getOutputs()) {
      if (!output->isVirtual()) {
        if (sharedLibName.empty()) {
          sharedLibName = output->getName();
        } else {
          ctx.error("unexpected explicit output: " + output->getName());
        }
      }
    }
    if (sharedLibName.empty()) {
      ctx.error("SharedLibraryTool requires the resulting shared library name "
                "to be specified");
    }
  }